

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O2

void duckdb::BoundParameterExpression::InvalidateRecursive(Expression *expr)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((expr->super_BaseExpression).type == VALUE_PARAMETER) {
    Invalidate(expr);
    return;
  }
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_parameter_expression.cpp:45:46)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_parameter_expression.cpp:45:46)>
             ::_M_manager;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void BoundParameterExpression::InvalidateRecursive(Expression &expr) {
	if (expr.GetExpressionType() == ExpressionType::VALUE_PARAMETER) {
		Invalidate(expr);
		return;
	}
	ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { InvalidateRecursive(child); });
}